

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resCore.c
# Opt level: O2

void Res_UpdateNetwork(Abc_Obj_t *pObj,Vec_Ptr_t *vFanins,Hop_Obj_t *pFunc,Vec_Vec_t *vLevels)

{
  Abc_Obj_t *pObjNew;
  Abc_Obj_t *pFanin;
  int i;
  
  pObjNew = Abc_NtkCreateObj(pObj->pNtk,ABC_OBJ_NODE);
  (pObjNew->field_5).pData = pFunc;
  for (i = 0; i < vFanins->nSize; i = i + 1) {
    pFanin = (Abc_Obj_t *)Vec_PtrEntry(vFanins,i);
    Abc_ObjAddFanin(pObjNew,pFanin);
  }
  Abc_NtkUpdate(pObj,pObjNew,vLevels);
  return;
}

Assistant:

void Res_UpdateNetwork( Abc_Obj_t * pObj, Vec_Ptr_t * vFanins, Hop_Obj_t * pFunc, Vec_Vec_t * vLevels )
{
    Abc_Obj_t * pObjNew, * pFanin;
    int k;

    // create the new node
    pObjNew = Abc_NtkCreateNode( pObj->pNtk );
    pObjNew->pData = pFunc;
    Vec_PtrForEachEntry( Abc_Obj_t *, vFanins, pFanin, k )
        Abc_ObjAddFanin( pObjNew, pFanin );
    // replace the old node by the new node
//printf( "Replacing node " ); Abc_ObjPrint( stdout, pObj );
//printf( "Inserting node " ); Abc_ObjPrint( stdout, pObjNew );
    // update the level of the node
    Abc_NtkUpdate( pObj, pObjNew, vLevels );
}